

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeProcessTreeFlagsData(xmlNodePtr tree,int flags,void *data)

{
  xmlXIncludeCtxtPtr ctxt_00;
  xmlChar *pxVar1;
  int local_34;
  int ret;
  xmlXIncludeCtxtPtr ctxt;
  void *data_local;
  int flags_local;
  xmlNodePtr tree_local;
  
  if (((tree == (xmlNodePtr)0x0) || (tree->type == XML_NAMESPACE_DECL)) ||
     (tree->doc == (_xmlDoc *)0x0)) {
    tree_local._4_4_ = -1;
  }
  else {
    ctxt_00 = xmlXIncludeNewContext(tree->doc);
    if (ctxt_00 == (xmlXIncludeCtxtPtr)0x0) {
      tree_local._4_4_ = -1;
    }
    else {
      ctxt_00->_private = data;
      pxVar1 = xmlStrdup(tree->doc->URL);
      ctxt_00->base = pxVar1;
      xmlXIncludeSetFlags(ctxt_00,flags);
      local_34 = xmlXIncludeDoProcess(ctxt_00,tree);
      if ((-1 < local_34) && (0 < ctxt_00->nbErrors)) {
        local_34 = -1;
      }
      xmlXIncludeFreeContext(ctxt_00);
      tree_local._4_4_ = local_34;
    }
  }
  return tree_local._4_4_;
}

Assistant:

int
xmlXIncludeProcessTreeFlagsData(xmlNodePtr tree, int flags, void *data) {
    xmlXIncludeCtxtPtr ctxt;
    int ret = 0;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL) ||
        (tree->doc == NULL))
        return(-1);

    ctxt = xmlXIncludeNewContext(tree->doc);
    if (ctxt == NULL)
        return(-1);
    ctxt->_private = data;
    ctxt->base = xmlStrdup((xmlChar *)tree->doc->URL);
    xmlXIncludeSetFlags(ctxt, flags);
    ret = xmlXIncludeDoProcess(ctxt, tree);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
        ret = -1;

    xmlXIncludeFreeContext(ctxt);
    return(ret);
}